

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sealwrap.cpp
# Opt level: O2

ssize_t __thiscall
Vault::Sys::Sealwrap::read_abi_cxx11_(Sealwrap *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url UStack_38;
  
  client = *(Client **)CONCAT44(in_register_00000034,__fd);
  getUrl_abi_cxx11_(&UStack_38,(Sealwrap *)CONCAT44(in_register_00000034,__fd));
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&UStack_38);
  std::__cxx11::string::~string((string *)&UStack_38);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::Sealwrap::read() {
  return HttpConsumer::get(client_, getUrl());
}